

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_container.h
# Opt level: O3

mapped_type * __thiscall
gtl::internal_btree::
btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
::operator[](btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
             *this,key_type *key)

{
  tuple<> local_29;
  _Head_base<0UL,_S2Shape_*const_&,_false> local_28;
  pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>,_bool>
  local_20;
  
  local_28._M_head_impl = key;
  btree<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>
  ::insert_unique<std::piecewise_construct_t_const&,std::tuple<S2Shape*const&>,std::tuple<>>
            (&local_20,
             (btree<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>
              *)this,key,(piecewise_construct_t *)&std::piecewise_construct,
             (tuple<S2Shape_*const_&> *)&local_28,&local_29);
  if (((ulong)local_20.first.node & 7) == 0) {
    return (mapped_type *)(local_20.first.node + (long)local_20.first.position * 0x20 + 0x18);
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                ,0x1e1,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2Shape *, std::vector<S2Shape *>>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2Shape *, std::vector<S2Shape *>>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
               );
}

Assistant:

mapped_type &operator[](const key_type &key) {
    return this->tree_
        .insert_unique(key, std::piecewise_construct,
                       std::forward_as_tuple(key), std::forward_as_tuple())
        .first->second;
  }